

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3ExprFree(Fts3Expr *pDel)

{
  Fts3Expr *pFVar1;
  bool bVar2;
  Fts3Expr *local_40;
  Fts3Expr *local_30;
  Fts3Expr *pParent;
  Fts3Expr *p;
  Fts3Expr *pDel_local;
  
  pParent = pDel;
  while( true ) {
    bVar2 = false;
    if ((pParent != (Fts3Expr *)0x0) && (bVar2 = true, pParent->pLeft == (Fts3Expr *)0x0)) {
      bVar2 = pParent->pRight != (Fts3Expr *)0x0;
    }
    pFVar1 = pParent;
    if (!bVar2) break;
    if (pParent->pLeft == (Fts3Expr *)0x0) {
      local_30 = pParent->pRight;
    }
    else {
      local_30 = pParent->pLeft;
    }
    pParent = local_30;
  }
  while (pParent = pFVar1, pParent != (Fts3Expr *)0x0) {
    pFVar1 = pParent->pParent;
    fts3FreeExprNode(pParent);
    if (((pFVar1 != (Fts3Expr *)0x0) && (pParent == pFVar1->pLeft)) &&
       (pFVar1->pRight != (Fts3Expr *)0x0)) {
      pParent = pFVar1->pRight;
      while( true ) {
        bVar2 = false;
        if ((pParent != (Fts3Expr *)0x0) && (bVar2 = true, pParent->pLeft == (Fts3Expr *)0x0)) {
          bVar2 = pParent->pRight != (Fts3Expr *)0x0;
        }
        pFVar1 = pParent;
        if (!bVar2) break;
        if (pParent->pLeft == (Fts3Expr *)0x0) {
          local_40 = pParent->pRight;
        }
        else {
          local_40 = pParent->pLeft;
        }
        pParent = local_40;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3ExprFree(Fts3Expr *pDel){
  Fts3Expr *p;
  assert( pDel==0 || pDel->pParent==0 );
  for(p=pDel; p && (p->pLeft||p->pRight); p=(p->pLeft ? p->pLeft : p->pRight)){
    assert( p->pParent==0 || p==p->pParent->pRight || p==p->pParent->pLeft );
  }
  while( p ){
    Fts3Expr *pParent = p->pParent;
    fts3FreeExprNode(p);
    if( pParent && p==pParent->pLeft && pParent->pRight ){
      p = pParent->pRight;
      while( p && (p->pLeft || p->pRight) ){
        assert( p==p->pParent->pRight || p==p->pParent->pLeft );
        p = (p->pLeft ? p->pLeft : p->pRight);
      }
    }else{
      p = pParent;
    }
  }
}